

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

void picojson::serialize_str<std::ostream_iterator<char,char,std::char_traits<char>>>
               (string *s,ostream_iterator<char,_char,_std::char_traits<char>_> *oi)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  ostream_type *poVar4;
  byte *__value;
  char buf [7];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_68;
  long local_58 [2];
  ostream_iterator<char,_char,_std::char_traits<char>_> *local_48;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_40;
  
  local_68._M_stream = (ostream_type *)CONCAT71(local_68._M_stream._1_7_,0x22);
  local_48 = oi;
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(oi,(char *)&local_68);
  if (s->_M_string_length != 0) {
    __value = (byte *)(s->_M_dataplus)._M_p;
    do {
      bVar1 = *__value;
      if (0x21 < bVar1) {
        if (bVar1 == 0x5c) {
          local_68._M_stream = (ostream_type *)local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\\\","");
          local_40._M_stream = local_48->_M_stream;
          local_40._M_string = local_48->_M_string;
          if (0 < (long)local_68._M_string) {
            pcVar2 = local_68._M_string + 1;
            poVar4 = local_68._M_stream;
            do {
              std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                        (&local_40,(char *)poVar4);
              poVar4 = poVar4 + 1;
              pcVar2 = pcVar2 + -1;
            } while (1 < (long)pcVar2);
          }
        }
        else if (bVar1 == 0x2f) {
          local_68._M_stream = (ostream_type *)local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\/","");
          local_40._M_stream = local_48->_M_stream;
          local_40._M_string = local_48->_M_string;
          if (0 < (long)local_68._M_string) {
            pcVar2 = local_68._M_string + 1;
            poVar4 = local_68._M_stream;
            do {
              std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                        (&local_40,(char *)poVar4);
              poVar4 = poVar4 + 1;
              pcVar2 = pcVar2 + -1;
            } while (1 < (long)pcVar2);
          }
        }
        else {
          if (bVar1 != 0x22) goto switchD_00106f40_caseD_b;
          local_68._M_stream = (ostream_type *)local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\\"","");
          local_40._M_stream = local_48->_M_stream;
          local_40._M_string = local_48->_M_string;
          if (0 < (long)local_68._M_string) {
            pcVar2 = local_68._M_string + 1;
            poVar4 = local_68._M_stream;
            do {
              std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                        (&local_40,(char *)poVar4);
              poVar4 = poVar4 + 1;
              pcVar2 = pcVar2 + -1;
            } while (1 < (long)pcVar2);
          }
        }
        goto LAB_00107235;
      }
      switch(bVar1) {
      case 8:
        local_68._M_stream = (ostream_type *)local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\b","");
        local_40._M_stream = local_48->_M_stream;
        local_40._M_string = local_48->_M_string;
        if (0 < (long)local_68._M_string) {
          pcVar2 = local_68._M_string + 1;
          poVar4 = local_68._M_stream;
          do {
            std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                      (&local_40,(char *)poVar4);
            poVar4 = poVar4 + 1;
            pcVar2 = pcVar2 + -1;
          } while (1 < (long)pcVar2);
        }
        break;
      case 9:
        local_68._M_stream = (ostream_type *)local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\t","");
        local_40._M_stream = local_48->_M_stream;
        local_40._M_string = local_48->_M_string;
        if (0 < (long)local_68._M_string) {
          pcVar2 = local_68._M_string + 1;
          poVar4 = local_68._M_stream;
          do {
            std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                      (&local_40,(char *)poVar4);
            poVar4 = poVar4 + 1;
            pcVar2 = pcVar2 + -1;
          } while (1 < (long)pcVar2);
        }
        break;
      case 10:
        local_68._M_stream = (ostream_type *)local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\n","");
        local_40._M_stream = local_48->_M_stream;
        local_40._M_string = local_48->_M_string;
        if (0 < (long)local_68._M_string) {
          pcVar2 = local_68._M_string + 1;
          poVar4 = local_68._M_stream;
          do {
            std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                      (&local_40,(char *)poVar4);
            poVar4 = poVar4 + 1;
            pcVar2 = pcVar2 + -1;
          } while (1 < (long)pcVar2);
        }
        break;
      default:
switchD_00106f40_caseD_b:
        if (bVar1 < 0x20 || bVar1 == 0x7f) {
          snprintf((char *)&local_40,7,"\\u%04x",(ulong)*__value);
          local_68._M_stream = local_48->_M_stream;
          local_68._M_string = local_48->_M_string;
          lVar3 = 0;
          do {
            std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                      (&local_68,(char *)((long)&local_40._M_stream + lVar3));
            lVar3 = lVar3 + 1;
          } while (lVar3 != 6);
        }
        else {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                    (local_48,(char *)__value);
        }
        goto LAB_00107250;
      case 0xc:
        local_68._M_stream = (ostream_type *)local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\f","");
        local_40._M_stream = local_48->_M_stream;
        local_40._M_string = local_48->_M_string;
        if (0 < (long)local_68._M_string) {
          pcVar2 = local_68._M_string + 1;
          poVar4 = local_68._M_stream;
          do {
            std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                      (&local_40,(char *)poVar4);
            poVar4 = poVar4 + 1;
            pcVar2 = pcVar2 + -1;
          } while (1 < (long)pcVar2);
        }
        break;
      case 0xd:
        local_68._M_stream = (ostream_type *)local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\\r","");
        local_40._M_stream = local_48->_M_stream;
        local_40._M_string = local_48->_M_string;
        if (0 < (long)local_68._M_string) {
          pcVar2 = local_68._M_string + 1;
          poVar4 = local_68._M_stream;
          do {
            std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                      (&local_40,(char *)poVar4);
            poVar4 = poVar4 + 1;
            pcVar2 = pcVar2 + -1;
          } while (1 < (long)pcVar2);
        }
      }
LAB_00107235:
      if (local_68._M_stream != (ostream_type *)local_58) {
        operator_delete(local_68._M_stream,local_58[0] + 1);
      }
LAB_00107250:
      __value = __value + 1;
    } while (__value != (byte *)((s->_M_dataplus)._M_p + s->_M_string_length));
  }
  local_68._M_stream = (ostream_type *)CONCAT71(local_68._M_stream._1_7_,0x22);
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(local_48,(char *)&local_68);
  return;
}

Assistant:

void serialize_str(const std::string& s, Iter oi) {
    *oi++ = '"';
    for (std::string::const_iterator i = s.begin(); i != s.end(); ++i) {
      switch (*i) {
#define MAP(val, sym) case val: copy(sym, oi); break
	MAP('"', "\\\"");
	MAP('\\', "\\\\");
	MAP('/', "\\/");
	MAP('\b', "\\b");
	MAP('\f', "\\f");
	MAP('\n', "\\n");
	MAP('\r', "\\r");
	MAP('\t', "\\t");
#undef MAP
      default:
	if ((unsigned char)*i < 0x20 || *i == 0x7f) {
	  char buf[7];
	  SNPRINTF(buf, sizeof(buf), "\\u%04x", *i & 0xff);
	  copy(buf, buf + 6, oi);
	  } else {
	  *oi++ = *i;
	}
	break;
      }
    }
    *oi++ = '"';
  }